

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  byte bVar1;
  uint uVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  char cVar5;
  int iVar6;
  ImGuiTableSettings *p;
  byte *pbVar7;
  ImGuiTableSettings *pIVar8;
  bool bVar9;
  byte bVar10;
  float fVar11;
  
  table->IsSettingsDirty = false;
  pIVar4 = GImGui;
  if ((table->Flags & 0x10) != 0) {
    return;
  }
  p = TableGetBoundSettings(table);
  if (p == (ImGuiTableSettings *)0x0) {
    p = TableSettingsCreate(table->ID,table->ColumnsCount);
    iVar6 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar4->SettingsTables,p);
    table->SettingsOffset = iVar6;
  }
  iVar6 = table->ColumnsCount;
  cVar5 = (char)iVar6;
  p->ColumnsCount = cVar5;
  if (p->ID == table->ID) {
    if ((cVar5 == iVar6) && ((int)cVar5 <= (int)p->ColumnsCountMax)) {
      pIVar3 = (table->Columns).Data;
      p->SaveFlags = 0;
      if (table->ColumnsCount < 1) {
        p->SaveFlags = p->SaveFlags & table->Flags;
        fVar11 = 0.0;
      }
      else {
        pIVar8 = p + 1;
        pbVar7 = &pIVar3->field_0x64;
        iVar6 = 0;
        bVar9 = false;
        do {
          fVar11 = *(float *)(pbVar7 + (ulong)((pbVar7[-0x50] & 4) == 0) * 8 + -0x40);
          pIVar8->ID = (ImGuiID)fVar11;
          *(char *)&pIVar8->RefScale = (char)iVar6;
          *(byte *)((long)&pIVar8->RefScale + 1) = pbVar7[-0x12];
          *(byte *)((long)&pIVar8->RefScale + 2) = pbVar7[-0xe];
          bVar10 = *pbVar7;
          bVar1 = *(byte *)((long)&pIVar8->RefScale + 3);
          *(byte *)((long)&pIVar8->RefScale + 3) = bVar1 & 0xfc | bVar10 & 3;
          bVar10 = bVar1 & 0xf8 | bVar10 & 3 | pbVar7[-10] << 2;
          *(byte *)((long)&pIVar8->RefScale + 3) = bVar10;
          *(byte *)((long)&pIVar8->RefScale + 3) = bVar10 & 0xf7 | pbVar7[-0x50] * '\x02' & 8;
          uVar2 = *(uint *)(pbVar7 + -0x50);
          if ((uVar2 & 4) == 0) {
            bVar9 = true;
          }
          if ((fVar11 != *(float *)(pbVar7 + -0x44)) ||
             (NAN(fVar11) || NAN(*(float *)(pbVar7 + -0x44)))) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 1;
          }
          if (iVar6 != (char)pbVar7[-0x12]) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 2;
          }
          if (pbVar7[-0xe] != 0xff) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 8;
          }
          if ((uVar2 & 1) == (uint)pbVar7[-10]) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 4;
          }
          iVar6 = iVar6 + 1;
          pIVar8 = (ImGuiTableSettings *)&pIVar8->ColumnsCount;
          pbVar7 = pbVar7 + 0x68;
        } while (iVar6 < table->ColumnsCount);
        p->SaveFlags = p->SaveFlags & table->Flags;
        fVar11 = 0.0;
        if (bVar9) {
          fVar11 = table->RefScale;
        }
      }
      p->RefScale = fVar11;
      MarkIniSettingsDirty();
      return;
    }
    __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                  ,0xb93,"void ImGui::TableSaveSettings(ImGuiTable *)");
  }
  __assert_fail("settings->ID == table->ID",
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                ,0xb92,"void ImGui::TableSaveSettings(ImGuiTable *)");
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}